

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O1

void Corrade::Containers::arrayResize<char,Corrade::Containers::ArrayMallocAllocator<char>>
               (char **array,char *param_2)

{
  char *__dest;
  char *pcVar1;
  Array<char,_void_(*)(char_*,_unsigned_long)> local_38;
  
  pcVar1 = array[1];
  if (pcVar1 != param_2) {
    if ((code *)array[2] == ArrayMallocAllocator<char>::deleter) {
      if ((char *)(*(long *)(*array + -8) - 8U) < param_2) {
        if (param_2 <= pcVar1) {
          pcVar1 = param_2;
        }
        ArrayMallocAllocator<char>::reallocate(array,(size_t)pcVar1,(size_t)param_2);
      }
      array[1] = param_2;
    }
    else {
      __dest = ArrayMallocAllocator<char>::allocate((size_t)param_2);
      pcVar1 = array[1];
      if (param_2 <= array[1]) {
        pcVar1 = param_2;
      }
      if (pcVar1 != (char *)0x0) {
        memcpy(__dest,*array,(size_t)pcVar1);
      }
      local_38._data = *array;
      *array = __dest;
      local_38._size = (size_t)array[1];
      array[1] = param_2;
      local_38._deleter = (_func_void_char_ptr_unsigned_long *)array[2];
      array[2] = (char *)ArrayMallocAllocator<char>::deleter;
      Array<char,_void_(*)(char_*,_unsigned_long)>::~Array(&local_38);
    }
  }
  return;
}

Assistant:

void arrayResize(Array<T>& array, Corrade::NoInitT, const std::size_t size) {
    /* Direct access & value caching to speed up debug builds */
    auto& arrayGuts = reinterpret_cast<Implementation::ArrayGuts<T>&>(array);
    const bool hasGrowingDeleter = arrayGuts.deleter == Allocator::deleter;

    /* New size is the same as the old one, nothing to do */
    if(arrayGuts.size == size) return;

    /* Reallocate if we don't have our growable deleter, as the default deleter
       might then call destructors even in the non-initialized area ... */
    if(!hasGrowingDeleter) {
        T* newArray = Allocator::allocate(size);
        Implementation::arrayMoveConstruct<T>(array, newArray,
            /* Move the min of the two sizes -- if we shrink, move only what
               will fit in the new array; if we extend, move only what's
               initialized in the original and left the rest not initialized */
            arrayGuts.size < size ? arrayGuts.size : size);
        array = Array<T>{newArray, size, Allocator::deleter};

        #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
        /* This should basically be a no-op, right? */
        __sanitizer_annotate_contiguous_container(
            Allocator::base(arrayGuts.data),
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size);
        #endif

    /* ... or the desired size is larger than the capacity. In that case make
       use of the reallocate() function that might be able to grow in-place. */
    } else if(Allocator::capacity(array) < size) {
        Allocator::reallocate(arrayGuts.data,
            /* Move the min of the two sizes -- if we shrink, move only what
               will fit in the new array; if we extend, move only what's
               initialized in the original and left the rest not initialized */
            arrayGuts.size < size ? arrayGuts.size : size, size);
        arrayGuts.size = size;

        #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
        /** @todo with std::realloc, is that really a new allocation? what
            should I do here? */
        /* This should basically be a no-op, right? */
        __sanitizer_annotate_contiguous_container(
            Allocator::base(arrayGuts.data),
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size);
        #endif

    /* Otherwise call a destructor on the extra elements. If we get here, we
       have our growable deleter and didn't need to reallocate (which would
       make this unnecessary). */
    } else {
        Implementation::arrayDestruct<T>(arrayGuts.data + size, arrayGuts.data + arrayGuts.size);
        /* This is a NoInit resize, so not constructing the new elements, only
           updating the size */
        #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
        __sanitizer_annotate_contiguous_container(
            Allocator::base(arrayGuts.data),
            arrayGuts.data + Allocator::capacity(array),
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + size);
        #endif
        arrayGuts.size = size;
    }
}